

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O1

void __thiscall
slang::SmallVectorBase<slang::parsing::Token>::reallocateTo
          (SmallVectorBase<slang::parsing::Token> *this,size_type newCapacity)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  pointer p;
  size_type sVar3;
  undefined8 uVar4;
  pointer pTVar5;
  long lVar6;
  
  pTVar5 = (pointer)operator_new(newCapacity << 4);
  p = this->data_;
  sVar3 = this->len;
  if (sVar3 != 0) {
    lVar6 = 0;
    do {
      puVar1 = (undefined8 *)((long)&p->kind + lVar6);
      uVar4 = puVar1[1];
      puVar2 = (undefined8 *)((long)&pTVar5->kind + lVar6);
      *puVar2 = *puVar1;
      puVar2[1] = uVar4;
      lVar6 = lVar6 + 0x10;
    } while (sVar3 << 4 != lVar6);
  }
  if (p != (pointer)this->firstElement) {
    operator_delete(p);
  }
  this->cap = newCapacity;
  this->data_ = pTVar5;
  return;
}

Assistant:

void reallocateTo(size_type newCapacity) {
        auto newData = (pointer)::operator new(newCapacity * sizeof(T));
        std::uninitialized_move(begin(), end(), newData);

        cleanup();
        cap = newCapacity;
        data_ = newData;
    }